

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O2

void Gia_ManQuantExist_rec(Gia_Man_t *p,int iObj,int *pRes)

{
  uint c;
  ulong uVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  Gia_Obj_t *pGVar5;
  int iObj_00;
  int iObj_01;
  uint uVar6;
  int Lits0 [2];
  int local_4c;
  int local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  
  iVar2 = Gia_ObjIsTravIdCurrentId(p,iObj);
  if (iVar2 != 0) {
    piVar4 = Vec_IntEntryP(&p->vCopiesTwo,iObj * 2);
    *pRes = *piVar4;
    pRes[1] = piVar4[1];
    return;
  }
  Gia_ObjSetTravIdCurrentId(p,iObj);
  pGVar5 = Gia_ManObj(p,iObj);
  uVar1 = *(ulong *)pGVar5;
  if ((~(uint)uVar1 & 0x9fffffff) == 0) {
    pRes[0] = 0;
    pRes[1] = 1;
  }
  else {
    iObj_00 = iObj - ((uint)uVar1 & 0x1fffffff);
    uVar6 = (uint)(uVar1 >> 0x20);
    iObj_01 = iObj - (uVar6 & 0x1fffffff);
    iVar2 = iObj_00;
    iVar3 = Gia_ManQuantCheckSupp(p,iObj_00,p->iSuppPi);
    if (iVar3 == 0) {
      local_40 = Abc_Var2Lit(iObj_00,iVar2);
      local_3c = local_40;
    }
    else {
      Gia_ManQuantExist_rec(p,iObj_00,&local_40);
    }
    c = (uint)(uVar1 >> 0x1d) & 1;
    uVar6 = uVar6 >> 0x1d & 1;
    iVar2 = iObj_01;
    iVar3 = Gia_ManQuantCheckSupp(p,iObj_01,p->iSuppPi);
    if (iVar3 == 0) {
      local_4c = Abc_Var2Lit(iObj_01,iVar2);
      local_48 = local_4c;
    }
    else {
      Gia_ManQuantExist_rec(p,iObj_01,&local_38);
      local_4c = local_38;
      local_48 = local_34;
    }
    iVar2 = Abc_LitNotCond(local_40,c);
    iVar3 = Abc_LitNotCond(local_4c,uVar6);
    iVar2 = Gia_ManHashAnd(p,iVar2,iVar3);
    *pRes = iVar2;
    iVar2 = Abc_LitNotCond(local_3c,c);
    iVar3 = Abc_LitNotCond(local_48,uVar6);
    iVar2 = Gia_ManHashAnd(p,iVar2,iVar3);
    pRes[1] = iVar2;
  }
  Gia_ObjCopySetTwoArray(p,iObj,pRes);
  return;
}

Assistant:

void Gia_ManQuantExist_rec( Gia_Man_t * p, int iObj, int pRes[2] )
{
    Gia_Obj_t * pObj;
    int Lits0[2], Lits1[2], pFans[2], fCompl[2];
    if ( Gia_ObjIsTravIdCurrentId( p, iObj ) )
    {
        Gia_ObjCopyGetTwoArray( p, iObj, pRes );
        return;
    }
    Gia_ObjSetTravIdCurrentId( p, iObj );
    pObj = Gia_ManObj( p, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        pRes[0] = 0; pRes[1] = 1;
        Gia_ObjCopySetTwoArray( p, iObj, pRes );
        return;
    }
    pFans[0]  = Gia_ObjFaninId0( pObj, iObj );
    pFans[1]  = Gia_ObjFaninId1( pObj, iObj );
    fCompl[0] = Gia_ObjFaninC0( pObj );
    fCompl[1] = Gia_ObjFaninC1( pObj );
    if ( Gia_ManQuantCheckSupp(p, pFans[0], p->iSuppPi) )
        Gia_ManQuantExist_rec( p, pFans[0], Lits0 );
    else
        Lits0[0] = Lits0[1] = Abc_Var2Lit( pFans[0], 0 );
    if ( Gia_ManQuantCheckSupp(p, pFans[1], p->iSuppPi) )
        Gia_ManQuantExist_rec( p, pFans[1], Lits1 );
    else
        Lits1[0] = Lits1[1] = Abc_Var2Lit( pFans[1], 0 );
    pRes[0] = Gia_ManHashAnd( p, Abc_LitNotCond(Lits0[0], fCompl[0]), Abc_LitNotCond(Lits1[0], fCompl[1]) );
    pRes[1] = Gia_ManHashAnd( p, Abc_LitNotCond(Lits0[1], fCompl[0]), Abc_LitNotCond(Lits1[1], fCompl[1]) );
    Gia_ObjCopySetTwoArray( p, iObj, pRes );
}